

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O3

ostream * plot::detail::operator<<(ostream *stream,value_type *line)

{
  Margin<plot::Frame<plot::BrailleCanvas_*>_> *pMVar1;
  ostream oVar2;
  ostream oVar3;
  long lVar4;
  int iVar5;
  ostream *poVar6;
  
  lVar4 = *(long *)(*(long *)stream + -0x18);
  poVar6 = stream + lVar4;
  if (stream[lVar4 + 0xe1] == (ostream)0x1) {
    oVar2 = poVar6[0xe0];
    oVar3 = (ostream)0x1;
  }
  else {
    oVar2 = (ostream)std::ios::widen((char)poVar6);
    poVar6[0xe0] = oVar2;
    poVar6[0xe1] = (ostream)0x1;
    lVar4 = *(long *)(*(long *)stream + -0x18);
    oVar3 = stream[lVar4 + 0xe1];
  }
  poVar6 = stream + lVar4;
  if (((byte)oVar3 & 1) == 0) {
    std::ios::widen((char)poVar6);
    poVar6[0xe1] = (ostream)0x1;
  }
  poVar6[0xe0] = (ostream)0x20;
  if (line->overflow_ == 0) {
    lVar4 = *(long *)stream;
    if (((line->line_).line_.line_.line_.it_._M_current !=
         (line->end_).line_.line_.line_.it_._M_current) ||
       ((line->line_).line_.overflow_ != (line->end_).line_.overflow_)) {
      *(long *)(stream + *(long *)(lVar4 + -0x18) + 0x10) = (long)(int)line->margin_->left_;
      std::__ostream_insert<char,std::char_traits<char>>(stream,"",0);
      poVar6 = operator<<(stream,&(line->line_).line_);
      iVar5 = (int)line->margin_->right_;
      lVar4 = *(long *)poVar6;
      goto LAB_00108131;
    }
  }
  else {
    lVar4 = *(long *)stream;
  }
  pMVar1 = line->margin_;
  iVar5 = (int)pMVar1->right_ + (int)((pMVar1->block_).block_)->cols_ + (int)pMVar1->left_ + 2;
  poVar6 = stream;
LAB_00108131:
  *(long *)(poVar6 + *(long *)(lVar4 + -0x18) + 0x10) = (long)iVar5;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"",0);
  poVar6 = stream + *(long *)(*(long *)stream + -0x18);
  if (stream[*(long *)(*(long *)stream + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar6);
    poVar6[0xe1] = (ostream)0x1;
  }
  poVar6[0xe0] = oVar2;
  return stream;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, margin_line<Block> const& line) {
        auto fill = stream.fill();
        stream << std::setfill(' ');
        if (!line.overflow_ && line.line_ != line.end_) {
            stream << std::setw(line.margin_->left_)
                   << u8""
                   << *line.line_
                   << std::setw(line.margin_->right_)
                   << u8"";
        } else {
            stream << std::setw(line.margin_->size().x)
                   << u8"";
        }

        return stream << std::setfill(fill);
    }